

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O2

QByteArray * __thiscall
QNetworkCookie::toRawForm(QByteArray *__return_storage_ptr__,QNetworkCookie *this,RawForm form)

{
  SameSite SVar1;
  bool bVar2;
  char cVar3;
  NetworkLayerProtocol NVar4;
  QNetworkCookiePrivate *pQVar5;
  char *pcVar6;
  char cVar7;
  long in_FS_OFFSET;
  QByteArrayView a;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_90;
  QDateTime local_78 [8];
  QLocale local_70 [8];
  QHostAddress hostAddr;
  QArrayDataPointer<char> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  pQVar5 = (this->d).d.ptr;
  if ((pQVar5->name).d.size != 0) {
    QByteArray::operator=(__return_storage_ptr__,&pQVar5->name);
    cVar7 = (char)__return_storage_ptr__;
    QByteArray::append(cVar7);
    QByteArray::append(__return_storage_ptr__);
    if (form == Full) {
      pQVar5 = (this->d).d.ptr;
      if (pQVar5->secure == true) {
        QByteArray::append(__return_storage_ptr__,"; secure");
        pQVar5 = (this->d).d.ptr;
      }
      if (pQVar5->httpOnly == true) {
        QByteArray::append(__return_storage_ptr__,"; HttpOnly");
        pQVar5 = (this->d).d.ptr;
      }
      if (pQVar5->sameSite != Default) {
        QByteArray::append(__return_storage_ptr__,"; SameSite=");
        SVar1 = ((this->d).d.ptr)->sameSite;
        if (SVar1 == Strict) {
          a = anon_unknown.dwarf_156fdb::sameSiteStrict();
        }
        else if (SVar1 == Lax) {
          a = anon_unknown.dwarf_156fdb::sameSiteLax();
        }
        else {
          a = (QByteArrayView)ZEXT816(0);
          if (SVar1 == None) {
            a = anon_unknown.dwarf_156fdb::sameSiteNone();
          }
        }
        QByteArray::append(__return_storage_ptr__,a);
      }
      bVar2 = isSessionCookie(this);
      if (!bVar2) {
        pcVar6 = "; expires=";
        QByteArray::append(__return_storage_ptr__,"; expires=");
        QLocale::c(local_70,pcVar6);
        QDateTime::toUTC();
        latin1.m_data = "ddd, dd-MMM-yyyy hh:mm:ss \'GMT";
        latin1.m_size = 0x1e;
        QString::QString((QString *)&local_90,latin1);
        QLocale::toString((QString *)&hostAddr,local_70,local_78,(QString *)&local_90);
        QString::toLatin1_helper_inplace((QString *)&local_50);
        QByteArray::append(__return_storage_ptr__);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&hostAddr);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
        QDateTime::~QDateTime(local_78);
        QLocale::~QLocale(local_70);
      }
      if ((((this->d).d.ptr)->domain).d.size != 0) {
        QByteArray::append(__return_storage_ptr__,"; domain=");
        cVar3 = QString::startsWith((QChar)((short)(this->d).d.ptr + L'\x10'),0x2e);
        if (cVar3 == '\0') {
          hostAddr.d.d.ptr =
               (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QHostAddress::QHostAddress(&hostAddr,&((this->d).d.ptr)->domain);
          NVar4 = QHostAddress::protocol(&hostAddr);
          if (NVar4 == IPv6Protocol) {
            QByteArray::append(cVar7);
            QString::toUtf8_helper((QString *)&local_50);
            QByteArray::append(__return_storage_ptr__);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
            QByteArray::append(cVar7);
          }
          else {
            QUrl::toAce(&local_50,&((this->d).d.ptr)->domain,0);
            QByteArray::append(__return_storage_ptr__);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
          }
          QHostAddress::~QHostAddress(&hostAddr);
        }
        else {
          QByteArray::append(cVar7);
          QString::mid((longlong)&hostAddr,(longlong)&((this->d).d.ptr)->domain);
          QUrl::toAce(&local_50,(QArrayDataPointer<char16_t> *)&hostAddr,0);
          QByteArray::append(__return_storage_ptr__);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&hostAddr);
        }
      }
      if ((((this->d).d.ptr)->path).d.size != 0) {
        QByteArray::append(__return_storage_ptr__,"; path=");
        QString::toUtf8_helper((QString *)&local_50);
        QByteArray::append(__return_storage_ptr__);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QNetworkCookie::toRawForm(RawForm form) const
{
    QByteArray result;
    if (d->name.isEmpty())
        return result;          // not a valid cookie

    result = d->name;
    result += '=';
    result += d->value;

    if (form == Full) {
        // same as above, but encoding everything back
        if (isSecure())
            result += "; secure";
        if (isHttpOnly())
            result += "; HttpOnly";
        if (d->sameSite != SameSite::Default) {
            result += "; SameSite=";
            result += sameSiteToRawString(d->sameSite);
        }
        if (!isSessionCookie()) {
            result += "; expires=";
            result += QLocale::c().toString(d->expirationDate.toUTC(),
                                            "ddd, dd-MMM-yyyy hh:mm:ss 'GMT"_L1).toLatin1();
        }
        if (!d->domain.isEmpty()) {
            result += "; domain=";
            if (d->domain.startsWith(u'.')) {
                result += '.';
                result += QUrl::toAce(d->domain.mid(1));
            } else {
                QHostAddress hostAddr(d->domain);
                if (hostAddr.protocol() == QAbstractSocket::IPv6Protocol) {
                    result += '[';
                    result += d->domain.toUtf8();
                    result += ']';
                } else {
                    result += QUrl::toAce(d->domain);
                }
            }
        }
        if (!d->path.isEmpty()) {
            result += "; path=";
            result += d->path.toUtf8();
        }
    }
    return result;
}